

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O3

void __thiscall OpenMD::RNEMD::RNEMD::collectData(RNEMD *this)

{
  int *piVar1;
  double dVar2;
  Snapshot *pSVar3;
  _func_int *p_Var4;
  undefined8 *puVar5;
  pointer piVar6;
  undefined1 auVar7 [16];
  double dVar8;
  RealType RVar9;
  undefined8 uVar10;
  uint i;
  int iVar11;
  uint uVar12;
  long lVar13;
  Molecule *pMVar14;
  double *pdVar15;
  Vector3d *pVVar16;
  __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
  _Var17;
  uint i_4;
  Vector3d *pVVar18;
  double (*padVar19) [3];
  uint j;
  int iVar20;
  long lVar21;
  double (*padVar22) [3];
  _func_int **pp_Var23;
  ulong uVar24;
  uint j_1;
  long lVar25;
  Mat3x3d *pMVar26;
  uint j_2;
  ulong uVar27;
  pointer ppSVar28;
  RigidBody *rb;
  StuntDouble *pSVar29;
  long *plVar30;
  byte bVar31;
  double tmp;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  Mat3x3d Ia;
  vector<double,_std::allocator<double>_> nden;
  Vector3d eField;
  AtomType *atype;
  MoleculeIterator miter;
  Vector3d omega;
  Vector<double,_3U> result_3;
  Vector3d vel;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  binTypeCounts;
  vector<int,_std::allocator<int>_> binEFieldCount;
  Vector3d rPos;
  vector<int,_std::allocator<int>_> binDOF;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> binEField;
  vector<double,_std::allocator<double>_> binMass;
  vector<int,_std::allocator<int>_> binCount;
  vector<double,_std::allocator<double>_> binKE;
  vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_> binI;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> binL;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> binP;
  Mat3x3d I;
  shared_ptr<OpenMD::SPFData> spfData;
  Vector3d L;
  vector<double,_std::allocator<double>_> binOmega;
  RealType area;
  double local_410;
  long local_408;
  Vector3d local_3e8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  double local_3a8 [2];
  undefined1 local_398 [16];
  vector<double,_std::allocator<double>_> local_388;
  undefined1 local_368 [16];
  double local_358;
  _func_int **local_350;
  MoleculeIterator local_348;
  int local_33c;
  Vector3d local_338;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  double local_2e8 [4];
  double local_2c8 [4];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_2a8;
  vector<int,_std::allocator<int>_> local_290;
  undefined1 local_278 [16];
  double local_268 [3];
  Mat3x3d *local_250;
  vector<int,_std::allocator<int>_> local_248;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_230;
  vector<double,_std::allocator<double>_> local_218;
  vector<int,_std::allocator<int>_> local_200;
  vector<double,_std::allocator<double>_> local_1e8;
  vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_> local_1d0;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_1b8;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_1a0;
  Mat3x3d local_188;
  long local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  Vector3d local_128;
  Vector3d local_108;
  Vector3d local_e8;
  double local_c8 [4];
  double local_a8 [3];
  vector<double,_std::allocator<double>_> local_90;
  Vector3d local_78;
  Vector3d local_58;
  RealType local_38;
  
  bVar31 = 0;
  if (this->doRNEMD_ == true) {
    pSVar3 = this->info_->sman_->currentSnapshot_;
    this->currentSnap_ = pSVar3;
    Snapshot::getHmat(&local_188,pSVar3);
    pMVar26 = &this->hmat_;
    if (pMVar26 != &local_188) {
      lVar13 = 0;
      do {
        *(undefined8 *)
         ((long)(this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                [0] + lVar13 + 0x10) =
             *(undefined8 *)
              ((long)local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                     [0] + lVar13 + 0x10);
        uVar10 = *(undefined8 *)
                  ((long)local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                         data_[0] + lVar13 + 8);
        puVar5 = (undefined8 *)
                 ((long)(pMVar26->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                        data_[0] + lVar13);
        *puVar5 = *(undefined8 *)
                   ((long)local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0] + lVar13);
        puVar5[1] = uVar10;
        lVar13 = lVar13 + 0x18;
      } while (lVar13 != 0x48);
    }
    local_38 = getDefaultDividingArea(this);
    Utils::Accumulator<double>::add(&this->areaAccumulator_,&local_38);
    local_a8[2] = (this->angularMomentumFluxVector_).super_Vector<double,_3U>.data_[2];
    local_a8[0] = (this->angularMomentumFluxVector_).super_Vector<double,_3U>.data_[0];
    local_a8[1] = (this->angularMomentumFluxVector_).super_Vector<double,_3U>.data_[1];
    dVar8 = 0.0;
    lVar13 = 0;
    do {
      dVar8 = dVar8 + local_a8[lVar13] * local_a8[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    lVar13 = 0;
    do {
      local_a8[lVar13] = local_a8[lVar13] / dVar8;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    if ((this->outputEvaluator_).isDynamic_ == true) {
      SelectionEvaluator::evaluate((SelectionSet *)&local_188,&this->outputEvaluator_);
      lVar13 = 0;
      do {
        std::vector<bool,_std::allocator<bool>_>::operator=
                  ((vector<bool,_std::allocator<bool>_> *)
                   ((long)&(((this->outputSeleMan_).ss_.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar13)
                   ,(vector<bool,_std::allocator<bool>_> *)
                    ((long)local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                           data_[0][0] + lVar13));
        lVar13 = lVar13 + 0x28;
      } while (lVar13 != 0xf0);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_188);
    }
    local_2c8[0] = 0.0;
    local_2c8[1] = 0.0;
    local_2c8[2] = 0.0;
    local_268[2] = 0.0;
    local_268[0] = 0.0;
    local_268[1] = 0.0;
    local_c8[2] = 0.0;
    local_c8[0] = 0.0;
    local_c8[1] = 0.0;
    local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
    local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
    local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
    local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
    local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
    local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
    local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
    local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    local_358 = 0.0;
    local_368 = ZEXT816(0);
    local_3e8.super_Vector<double,_3U>.data_[0] = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_218,(ulong)this->nBins_,(value_type_conflict1 *)&local_3e8,
               (allocator_type *)&local_338);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              (&local_1a0,(ulong)this->nBins_,(value_type *)OpenMD::V3Zero,
               (allocator_type *)&local_3e8);
    local_3e8.super_Vector<double,_3U>.data_[0] = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_90,(ulong)this->nBins_,(value_type_conflict1 *)&local_3e8,
               (allocator_type *)&local_338);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              (&local_1b8,(ulong)this->nBins_,(value_type *)OpenMD::V3Zero,
               (allocator_type *)&local_3e8);
    std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
    vector(&local_1d0,(ulong)this->nBins_,(allocator_type *)&local_3e8);
    local_3e8.super_Vector<double,_3U>.data_[0] = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_1e8,(ulong)this->nBins_,(value_type_conflict1 *)&local_3e8,
               (allocator_type *)&local_338);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              (&local_230,(ulong)this->nBins_,(value_type *)OpenMD::V3Zero,
               (allocator_type *)&local_3e8);
    local_3e8.super_Vector<double,_3U>.data_[0] =
         (double)((ulong)local_3e8.super_Vector<double,_3U>.data_[0] & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_248,(ulong)this->nBins_,(value_type_conflict2 *)&local_3e8,
               (allocator_type *)&local_338);
    local_3e8.super_Vector<double,_3U>.data_[0] =
         (double)((ulong)local_3e8.super_Vector<double,_3U>.data_[0] & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_200,(ulong)this->nBins_,(value_type_conflict2 *)&local_3e8,
               (allocator_type *)&local_338);
    local_3e8.super_Vector<double,_3U>.data_[0] =
         (double)((ulong)local_3e8.super_Vector<double,_3U>.data_[0] & 0xffffffff00000000);
    local_250 = pMVar26;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_290,(ulong)this->nBins_,(value_type_conflict2 *)&local_3e8,
               (allocator_type *)&local_338);
    local_2a8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((((this->outputMask_).super__Base_bitset<1UL>._M_w & 0x40) != 0) &&
       (std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::resize(&local_2a8,(ulong)this->nBins_), this->nBins_ != 0)) {
      lVar13 = 0;
      uVar27 = 0;
      do {
        local_3e8.super_Vector<double,_3U>.data_[0] =
             (double)((ulong)local_3e8.super_Vector<double,_3U>.data_[0] & 0xffffffff00000000);
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&((local_2a8.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar13),
                   (long)(this->outputTypes_).
                         super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->outputTypes_).
                         super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3,
                   (value_type_conflict2 *)&local_3e8);
        uVar27 = uVar27 + 1;
        lVar13 = lVar13 + 0x18;
      } while (uVar27 < this->nBins_);
    }
    local_348._M_node = (_Base_ptr)0x0;
    Snapshot::getSPFData(this->currentSnap_);
    pMVar14 = SimInfo::beginMolecule(this->info_,&local_348);
    while (pMVar14 != (Molecule *)0x0) {
      iVar11 = pMVar14->globalIndex_;
      if (iVar11 != *(int *)(local_138 + 0x20)) {
        ppSVar28 = (pMVar14->integrableObjects_).
                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_278._0_8_ = pMVar14;
        if ((ppSVar28 !=
             (pMVar14->integrableObjects_).
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_finish) &&
           (pSVar29 = *ppSVar28, pSVar29 != (StuntDouble *)0x0)) {
          do {
            iVar11 = pSVar29->globalIndex_;
            uVar27 = (ulong)iVar11;
            iVar20 = iVar11 + 0x3f;
            if (-1 < (long)uVar27) {
              iVar20 = iVar11;
            }
            if ((*(ulong *)((long)(iVar20 >> 6) * 8 +
                            *(long *)&(((this->outputSeleMan_).ss_.bitsets_.
                                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                      super__Bvector_base<std::allocator<bool>_> + -8 +
                           (ulong)((uVar27 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar27 & 0x3f) & 1) != 0) {
              lVar13 = *(long *)((long)&(pSVar29->snapshotMan_->currentSnapshot_->atomData).position
                                        .
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar29->storage_);
              pdVar15 = (double *)(lVar13 + (long)pSVar29->localIndex_ * 0x18);
              local_58.super_Vector<double,_3U>.data_[0] = *pdVar15;
              local_58.super_Vector<double,_3U>.data_[1] = pdVar15[1];
              local_58.super_Vector<double,_3U>.data_[2] =
                   *(double *)(lVar13 + 0x10 + (long)pSVar29->localIndex_ * 0x18);
              iVar11 = getBin(this,&local_58);
              local_398._0_4_ = iVar11;
              dVar8 = pSVar29->mass_;
              pSVar3 = pSVar29->snapshotMan_->currentSnapshot_;
              lVar13 = *(long *)((long)&(pSVar3->atomData).velocity.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar29->storage_);
              lVar21 = (long)pSVar29->localIndex_ * 0x18;
              pdVar15 = (double *)(lVar13 + lVar21);
              local_2c8[2] = *(double *)(lVar13 + 0x10 + lVar21);
              local_2c8[0] = *pdVar15;
              local_2c8[1] = pdVar15[1];
              lVar13 = *(long *)((long)&(pSVar3->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar29->storage_);
              local_338.super_Vector<double,_3U>.data_[2] = *(double *)(lVar13 + 0x10 + lVar21);
              pdVar15 = (double *)(lVar13 + lVar21);
              local_338.super_Vector<double,_3U>.data_[0] = *pdVar15;
              local_338.super_Vector<double,_3U>.data_[1] = pdVar15[1];
              local_3e8.super_Vector<double,_3U>.data_[0] = 0.0;
              local_3e8.super_Vector<double,_3U>.data_[1] = 0.0;
              local_3e8.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar13 = 0;
              do {
                local_3e8.super_Vector<double,_3U>.data_[lVar13] =
                     local_338.super_Vector<double,_3U>.data_[lVar13] -
                     (this->coordinateOrigin_).super_Vector<double,_3U>.data_[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_268[2] = local_3e8.super_Vector<double,_3U>.data_[2];
              local_268[0] = local_3e8.super_Vector<double,_3U>.data_[0];
              local_268[1] = local_3e8.super_Vector<double,_3U>.data_[1];
              local_410 = 0.0;
              lVar13 = 0;
              pVVar18 = &local_338;
              do {
                local_410 = local_410 + local_2c8[lVar13] * local_2c8[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_410 = dVar8 * 0.5 * local_410;
              iVar11 = 3;
              if (pSVar29->objType_ - otDAtom < 2) {
                lVar13 = *(long *)((long)&(pSVar29->snapshotMan_->currentSnapshot_->atomData).
                                          angularMomentum.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  pSVar29->storage_);
                local_338.super_Vector<double,_3U>.data_[2] =
                     *(double *)(lVar13 + 0x10 + (long)pSVar29->localIndex_ * 0x18);
                pdVar15 = (double *)(lVar13 + (long)pSVar29->localIndex_ * 0x18);
                local_338.super_Vector<double,_3U>.data_[0] = *pdVar15;
                local_338.super_Vector<double,_3U>.data_[1] = pdVar15[1];
                (*pSVar29->_vptr_StuntDouble[5])(&local_3e8);
                if (pSVar29->linear_ == true) {
                  iVar11 = pSVar29->linearAxis_;
                  uVar24 = (ulong)(((iVar11 + 1) / 3) * -3 + iVar11 + 1);
                  uVar27 = (ulong)(iVar11 + ((iVar11 + 2) / 3) * -3 + 2);
                  dVar2 = local_338.super_Vector<double,_3U>.data_[uVar24];
                  dVar2 = (dVar2 * dVar2) / *(double *)((long)&local_3e8 + uVar24 * 0x20);
                  local_338.super_Vector<double,_3U>.data_[2] =
                       local_338.super_Vector<double,_3U>.data_[uVar27];
                  local_338.super_Vector<double,_3U>.data_[2] =
                       local_338.super_Vector<double,_3U>.data_[2] *
                       local_338.super_Vector<double,_3U>.data_[2];
                  pdVar15 = (double *)((long)&local_3e8 + uVar27 * 0x20);
                  iVar11 = 5;
                }
                else {
                  auVar32._0_8_ =
                       local_338.super_Vector<double,_3U>.data_[0] *
                       local_338.super_Vector<double,_3U>.data_[0];
                  auVar32._8_8_ =
                       local_338.super_Vector<double,_3U>.data_[1] *
                       local_338.super_Vector<double,_3U>.data_[1];
                  auVar33._8_4_ = (int)local_3c8;
                  auVar33._0_8_ = local_3e8.super_Vector<double,_3U>.data_[0];
                  auVar33._12_4_ = (int)((ulong)local_3c8 >> 0x20);
                  auVar33 = divpd(auVar32,auVar33);
                  dVar2 = auVar33._8_8_ + auVar33._0_8_;
                  local_338.super_Vector<double,_3U>.data_[2] =
                       local_338.super_Vector<double,_3U>.data_[2] *
                       local_338.super_Vector<double,_3U>.data_[2];
                  iVar11 = 6;
                  pdVar15 = local_3a8;
                }
                local_410 = local_410 +
                            (local_338.super_Vector<double,_3U>.data_[2] / *pdVar15 + dVar2) * 0.5;
              }
              local_33c = iVar11;
              local_338.super_Vector<double,_3U>.data_[0] =
                   local_2c8[2] * local_268[1] - local_268[2] * local_2c8[1];
              local_338.super_Vector<double,_3U>.data_[1] =
                   local_2c8[0] * local_268[2] - local_268[0] * local_2c8[2];
              local_338.super_Vector<double,_3U>.data_[2] =
                   local_268[0] * local_2c8[1] - local_2c8[0] * local_268[1];
              local_3e8.super_Vector<double,_3U>.data_[0] = 0.0;
              local_3e8.super_Vector<double,_3U>.data_[1] = 0.0;
              local_3e8.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar13 = 0;
              do {
                local_3e8.super_Vector<double,_3U>.data_[lVar13] =
                     local_338.super_Vector<double,_3U>.data_[lVar13] * dVar8;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_c8[2] = local_3e8.super_Vector<double,_3U>.data_[2];
              local_c8[0] = local_3e8.super_Vector<double,_3U>.data_[0];
              local_c8[1] = local_3e8.super_Vector<double,_3U>.data_[1];
              local_308 = 0;
              uStack_300 = 0;
              local_318 = 0;
              uStack_310 = 0;
              local_338.super_Vector<double,_3U>.data_[2] = 0.0;
              uStack_320 = 0;
              local_338.super_Vector<double,_3U>.data_[0] = 0.0;
              local_338.super_Vector<double,_3U>.data_[1] = 0.0;
              local_2f8 = 0;
              lVar13 = 0;
              pVVar16 = pVVar18;
              do {
                dVar2 = local_268[lVar13];
                lVar21 = 0;
                do {
                  (pVVar16->super_Vector<double,_3U>).data_[lVar21] = local_268[lVar21] * dVar2;
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 3);
                lVar13 = lVar13 + 1;
                pVVar16 = pVVar16 + 1;
              } while (lVar13 != 3);
              local_3b8 = 0;
              uStack_3b0 = 0;
              local_3c8 = 0;
              uStack_3c0 = 0;
              local_3e8.super_Vector<double,_3U>.data_[2] = 0.0;
              uStack_3d0 = 0;
              local_3e8.super_Vector<double,_3U>.data_[0] = 0.0;
              local_3e8.super_Vector<double,_3U>.data_[1] = 0.0;
              local_3a8[0] = 0.0;
              lVar13 = 0;
              pVVar16 = &local_3e8;
              do {
                lVar21 = 0;
                do {
                  (pVVar16->super_Vector<double,_3U>).data_[lVar21] =
                       (pVVar18->super_Vector<double,_3U>).data_[lVar21] * dVar8;
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 3);
                lVar13 = lVar13 + 1;
                pVVar16 = pVVar16 + 1;
                pVVar18 = pVVar18 + 1;
              } while (lVar13 != 3);
              pVVar18 = &local_3e8;
              pMVar26 = &local_188;
              for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pMVar26->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                [0] = (pVVar18->super_Vector<double,_3U>).data_[0];
                pVVar18 = (Vector3d *)((long)pVVar18 + ((ulong)bVar31 * -2 + 1) * 8);
                pMVar26 = (Mat3x3d *)((long)pMVar26 + ((ulong)bVar31 * -2 + 1) * 8);
              }
              dVar2 = 0.0;
              lVar13 = 0;
              do {
                dVar2 = dVar2 + local_268[lVar13] * local_268[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              dVar2 = dVar2 * dVar8;
              local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
                   local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                   [0] + dVar2;
              local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
                   local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
                   [1] + dVar2;
              local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
                   dVar2 + local_188.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                           data_[2][2];
              if (((this->outputMask_).super__Base_bitset<1UL>._M_w & 0x40) != 0) {
                if (pSVar29->objType_ == otRigidBody) {
                  for (pp_Var23 = (_func_int **)pSVar29[2].mass_;
                      (pp_Var23 != pSVar29[2].properties_._vptr_PropertyMap &&
                      (p_Var4 = *pp_Var23, p_Var4 != (_func_int *)0x0)); pp_Var23 = pp_Var23 + 1) {
                    pVVar18 = (Vector3d *)
                              ((long)*(int *)(p_Var4 + 0x30) * 0x18 +
                              *(long *)(*(long *)(*(long *)(p_Var4 + 0x18) + 0x18) +
                                       *(long *)(p_Var4 + 0x10)));
                    local_e8.super_Vector<double,_3U>.data_[0] = 0.0;
                    local_e8.super_Vector<double,_3U>.data_[1] = 0.0;
                    local_e8.super_Vector<double,_3U>.data_[2] = 0.0;
                    if (pVVar18 != &local_e8) {
                      lVar13 = 0;
                      do {
                        local_e8.super_Vector<double,_3U>.data_[lVar13] =
                             (pVVar18->super_Vector<double,_3U>).data_[lVar13];
                        lVar13 = lVar13 + 1;
                      } while (lVar13 != 3);
                    }
                    uVar12 = getBin(this,&local_e8);
                    local_350 = *(_func_int ***)(p_Var4 + 0x78);
                    _Var17 = std::
                             __find_if<__gnu_cxx::__normal_iterator<OpenMD::AtomType**,std::vector<OpenMD::AtomType*,std::allocator<OpenMD::AtomType*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::AtomType*const>>
                                       ((this->outputTypes_).
                                        super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (this->outputTypes_).
                                        super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,&local_350);
                    iVar11 = (int)((ulong)((long)_Var17._M_current -
                                          (long)(this->outputTypes_).
                                                super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
                    if (_Var17._M_current ==
                        (this->outputTypes_).
                        super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
                      iVar11 = -1;
                    }
                    if (((-1 < (int)uVar12) && (iVar11 != -1)) && ((int)uVar12 < (int)this->nBins_))
                    {
                      piVar1 = local_2a8.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar12].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + iVar11;
                      *piVar1 = *piVar1 + 1;
                    }
                  }
                }
                else if (pSVar29->objType_ < otRigidBody) {
                  local_350 = pSVar29[1]._vptr_StuntDouble;
                  _Var17 = std::
                           __find_if<__gnu_cxx::__normal_iterator<OpenMD::AtomType**,std::vector<OpenMD::AtomType*,std::allocator<OpenMD::AtomType*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::AtomType*const>>
                                     ((this->outputTypes_).
                                      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (this->outputTypes_).
                                      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,&local_350);
                  iVar11 = (int)((ulong)((long)_Var17._M_current -
                                        (long)(this->outputTypes_).
                                              super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
                  if (_Var17._M_current ==
                      (this->outputTypes_).
                      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    iVar11 = -1;
                  }
                  if ((((-1 < (int)local_398._0_4_) && ((int)local_398._0_4_ < (int)this->nBins_))
                      && (iVar11 != -1)) &&
                     (((this->outputMask_).super__Base_bitset<1UL>._M_w & 0x40) != 0)) {
                    piVar1 = local_2a8.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[(uint)local_398._0_4_].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + iVar11;
                    *piVar1 = *piVar1 + 1;
                  }
                }
              }
              if ((-1 < (int)local_398._0_4_) && ((int)local_398._0_4_ < (int)this->nBins_)) {
                uVar27 = (ulong)(uint)local_398._0_4_;
                local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar27] =
                     local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar27] + 1;
                local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar27] =
                     local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar27] + dVar8;
                local_3e8.super_Vector<double,_3U>.data_[0] = 0.0;
                local_3e8.super_Vector<double,_3U>.data_[1] = 0.0;
                local_3e8.super_Vector<double,_3U>.data_[2] = 0.0;
                lVar13 = 0;
                do {
                  local_3e8.super_Vector<double,_3U>.data_[lVar13] = local_2c8[lVar13] * dVar8;
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 3);
                lVar13 = 0;
                do {
                  local_1a0.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar27].super_Vector<double,_3U>.data_
                  [lVar13] = local_3e8.super_Vector<double,_3U>.data_[lVar13] +
                             local_1a0.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar27].
                             super_Vector<double,_3U>.data_[lVar13];
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 3);
                local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar27] =
                     local_410 +
                     local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar27];
                padVar22 = (double (*) [3])
                           (local_1d0.
                            super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar27);
                padVar19 = (double (*) [3])&local_188;
                lVar13 = 0;
                do {
                  lVar21 = 0;
                  do {
                    (((SquareMatrix<double,_3> *)*padVar22)->super_RectMatrix<double,_3U,_3U>).data_
                    [0][lVar21] = (((SquareMatrix<double,_3> *)*padVar19)->
                                  super_RectMatrix<double,_3U,_3U>).data_[0][lVar21] +
                                  (((SquareMatrix<double,_3> *)*padVar22)->
                                  super_RectMatrix<double,_3U,_3U>).data_[0][lVar21];
                    lVar21 = lVar21 + 1;
                  } while (lVar21 != 3);
                  lVar13 = lVar13 + 1;
                  padVar22 = padVar22 + 1;
                  padVar19 = padVar19 + 1;
                } while (lVar13 != 3);
                lVar13 = 0;
                do {
                  local_1b8.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar27].super_Vector<double,_3U>.data_
                  [lVar13] = local_c8[lVar13] +
                             local_1b8.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar27].
                             super_Vector<double,_3U>.data_[lVar13];
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 3);
                local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar27] =
                     local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar27] + local_33c;
              }
            }
            if (((this->outputMask_).super__Base_bitset<1UL>._M_w & 0x80) != 0) {
              if (pSVar29->objType_ == otRigidBody) {
                for (pp_Var23 = (_func_int **)pSVar29[2].mass_;
                    (pp_Var23 != pSVar29[2].properties_._vptr_PropertyMap &&
                    (p_Var4 = *pp_Var23, p_Var4 != (_func_int *)0x0)); pp_Var23 = pp_Var23 + 1) {
                  pVVar18 = (Vector3d *)
                            ((long)*(int *)(p_Var4 + 0x30) * 0x18 +
                            *(long *)(*(long *)(*(long *)(p_Var4 + 0x18) + 0x18) +
                                     *(long *)(p_Var4 + 0x10)));
                  local_108.super_Vector<double,_3U>.data_[0] = 0.0;
                  local_108.super_Vector<double,_3U>.data_[1] = 0.0;
                  local_108.super_Vector<double,_3U>.data_[2] = 0.0;
                  if (pVVar18 != &local_108) {
                    lVar13 = 0;
                    do {
                      local_108.super_Vector<double,_3U>.data_[lVar13] =
                           (pVVar18->super_Vector<double,_3U>).data_[lVar13];
                      lVar13 = lVar13 + 1;
                    } while (lVar13 != 3);
                  }
                  uVar12 = getBin(this,&local_108);
                  lVar13 = *(long *)(*(long *)(*(long *)(p_Var4 + 0x18) + 0x18) + 0x120 +
                                    *(long *)(p_Var4 + 0x10));
                  local_358 = *(double *)(lVar13 + 0x10 + (long)*(int *)(p_Var4 + 0x30) * 0x18);
                  local_368 = *(undefined1 (*) [16])(lVar13 + (long)*(int *)(p_Var4 + 0x30) * 0x18);
                  if ((-1 < (int)uVar12) && ((int)uVar12 < (int)this->nBins_)) {
                    local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar12] =
                         local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar12] + 1;
                    lVar13 = 0;
                    do {
                      local_230.
                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar12].super_Vector<double,_3U>.
                      data_[lVar13] =
                           *(double *)(local_368 + lVar13 * 8) +
                           local_230.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar12].
                           super_Vector<double,_3U>.data_[lVar13];
                      lVar13 = lVar13 + 1;
                    } while (lVar13 != 3);
                  }
                }
              }
              else {
                pSVar3 = pSVar29->snapshotMan_->currentSnapshot_;
                lVar13 = *(long *)((long)&(pSVar3->atomData).electricField.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  pSVar29->storage_);
                lVar21 = (long)pSVar29->localIndex_ * 0x18;
                local_368 = *(undefined1 (*) [16])(lVar13 + lVar21);
                local_358 = *(double *)(lVar13 + 0x10 + lVar21);
                pVVar18 = (Vector3d *)
                          (lVar21 + *(long *)((long)&(pSVar3->atomData).position.
                                                                                                          
                                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                             pSVar29->storage_));
                local_128.super_Vector<double,_3U>.data_[0] = 0.0;
                local_128.super_Vector<double,_3U>.data_[1] = 0.0;
                local_128.super_Vector<double,_3U>.data_[2] = 0.0;
                if (pVVar18 != &local_128) {
                  lVar13 = 0;
                  do {
                    local_128.super_Vector<double,_3U>.data_[lVar13] =
                         (pVVar18->super_Vector<double,_3U>).data_[lVar13];
                    lVar13 = lVar13 + 1;
                  } while (lVar13 != 3);
                }
                uVar12 = getBin(this,&local_128);
                if ((-1 < (int)uVar12) && ((int)uVar12 < (int)this->nBins_)) {
                  local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar12] =
                       local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar12] + 1;
                  lVar13 = 0;
                  do {
                    local_230.
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar12].super_Vector<double,_3U>.data_
                    [lVar13] = *(double *)(local_368 + lVar13 * 8) +
                               local_230.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar12].
                               super_Vector<double,_3U>.data_[lVar13];
                    lVar13 = lVar13 + 1;
                  } while (lVar13 != 3);
                }
              }
            }
            ppSVar28 = ppSVar28 + 1;
          } while ((ppSVar28 != *(pointer *)(local_278._0_8_ + 0xa8)) &&
                  (pSVar29 = *ppSVar28, pSVar29 != (StuntDouble *)0x0));
          iVar11 = *(int *)(local_278._0_8_ + 8);
        }
        iVar20 = iVar11 + 0x3f;
        if (-1 < iVar11) {
          iVar20 = iVar11;
        }
        uVar10 = local_278._0_8_;
        if ((*(ulong *)((long)(iVar20 >> 6) * 8 +
                        *(long *)&(this->outputSeleMan_).ss_.bitsets_.
                                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                  ._M_impl.super__Vector_impl_data._M_start[5].bitset_.
                                  super__Bvector_base<std::allocator<bool>_> + -8 +
                       (ulong)(((long)iVar11 & 0x800000000000003fU) < 0x8000000000000001) * 8) >>
             ((long)iVar11 & 0x3fU) & 1) != 0) {
          for (plVar30 = *(long **)(local_278._0_8_ + 0xd0);
              (plVar30 != *(long **)(uVar10 + 0xd8) &&
              (puVar5 = (undefined8 *)*plVar30, puVar5 != (undefined8 *)0x0)); plVar30 = plVar30 + 1
              ) {
            lVar13 = *(long *)*puVar5;
            pVVar18 = (Vector3d *)
                      ((long)*(int *)(lVar13 + 0x30) * 0x18 +
                      *(long *)(*(long *)(*(long *)(lVar13 + 0x18) + 0x18) +
                               *(long *)(lVar13 + 0x10)));
            local_3e8.super_Vector<double,_3U>.data_[0] = 0.0;
            local_3e8.super_Vector<double,_3U>.data_[1] = 0.0;
            local_3e8.super_Vector<double,_3U>.data_[2] = 0.0;
            if (pVVar18 != &local_3e8) {
              lVar13 = 0;
              do {
                local_3e8.super_Vector<double,_3U>.data_[lVar13] =
                     (pVVar18->super_Vector<double,_3U>).data_[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
            }
            lVar13 = *(long *)puVar5[1];
            pVVar18 = (Vector3d *)
                      ((long)*(int *)(lVar13 + 0x30) * 0x18 +
                      *(long *)(*(long *)(*(long *)(lVar13 + 0x18) + 0x18) +
                               *(long *)(lVar13 + 0x10)));
            local_338.super_Vector<double,_3U>.data_[0] = 0.0;
            local_338.super_Vector<double,_3U>.data_[1] = 0.0;
            local_338.super_Vector<double,_3U>.data_[2] = 0.0;
            if (pVVar18 != &local_338) {
              lVar13 = 0;
              do {
                local_338.super_Vector<double,_3U>.data_[lVar13] =
                     (pVVar18->super_Vector<double,_3U>).data_[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
            }
            if (this->usePeriodicBoundaryConditions_ == true) {
              Snapshot::wrapVector(this->currentSnap_,&local_3e8);
              Snapshot::wrapVector(this->currentSnap_,&local_338);
            }
            local_2e8[0] = 0.0;
            local_2e8[1] = 0.0;
            local_2e8[2] = 0.0;
            lVar13 = 0;
            do {
              local_2e8[lVar13] =
                   local_3e8.super_Vector<double,_3U>.data_[lVar13] +
                   local_338.super_Vector<double,_3U>.data_[lVar13];
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
            local_388.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_388.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_388.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            lVar13 = 0;
            do {
              (&local_388.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start)[lVar13] = (pointer)(local_2e8[lVar13] * 0.5);
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
            local_78.super_Vector<double,_3U>.data_[2] =
                 (double)local_388.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
            local_78.super_Vector<double,_3U>.data_[0] =
                 (double)local_388.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
            local_78.super_Vector<double,_3U>.data_[1] =
                 (double)local_388.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish;
            iVar11 = getBin(this,&local_78);
            local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar11] =
                 local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar11] + -1;
          }
        }
      }
      pMVar14 = SimInfo::nextMolecule(this->info_,&local_348);
    }
    if (this->nBins_ != 0) {
      local_410 = 0.0;
      lVar13 = 0;
      local_408 = 0;
      lVar21 = 0;
      uVar27 = 0;
      do {
        MPI_Allreduce(1,(long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar21,1,&ompi_mpi_int,
                      &ompi_mpi_op_sum,&ompi_mpi_comm_world);
        MPI_Allreduce(1,(long)local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + local_408,1,&ompi_mpi_double,
                      &ompi_mpi_op_sum,&ompi_mpi_comm_world);
        MPI_Allreduce(1,(long)((local_1a0.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>
                              ).data_ + lVar13,3,&ompi_mpi_double,&ompi_mpi_op_sum,
                      &ompi_mpi_comm_world);
        MPI_Allreduce(1,(long)((local_1b8.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>
                              ).data_ + lVar13,3,&ompi_mpi_double,&ompi_mpi_op_sum,
                      &ompi_mpi_comm_world);
        MPI_Allreduce(1,(long)((local_1d0.
                                super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                              [0] + (long)local_410,9,&ompi_mpi_double,&ompi_mpi_op_sum,
                      &ompi_mpi_comm_world);
        MPI_Allreduce(1,(long)local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + local_408,1,&ompi_mpi_double,
                      &ompi_mpi_op_sum,&ompi_mpi_comm_world);
        MPI_Allreduce(1,(long)local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar21,1,&ompi_mpi_int,
                      &ompi_mpi_op_sum,&ompi_mpi_comm_world);
        local_398._0_8_ = uVar27;
        uVar27 = (this->outputMask_).super__Base_bitset<1UL>._M_w;
        if ((char)uVar27 < '\0') {
          MPI_Allreduce(1,(long)local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar21,1,&ompi_mpi_int,
                        &ompi_mpi_op_sum,&ompi_mpi_comm_world);
          MPI_Allreduce(1,(long)((local_230.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super_Vector<double,_3U>).data_ + lVar13,3,&ompi_mpi_double,
                        &ompi_mpi_op_sum,&ompi_mpi_comm_world);
          uVar27 = (this->outputMask_).super__Base_bitset<1UL>._M_w;
        }
        uVar10 = local_398._0_8_;
        if ((uVar27 & 0x40) != 0) {
          MPI_Allreduce(1,*(undefined8 *)
                           ((long)&((local_2a8.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar13),
                        (ulong)((long)(this->outputTypes_).
                                      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->outputTypes_).
                                     super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3,&ompi_mpi_int,
                        &ompi_mpi_op_sum,&ompi_mpi_comm_world);
        }
        uVar27 = uVar10 + 1;
        lVar21 = lVar21 + 4;
        local_408 = local_408 + 8;
        lVar13 = lVar13 + 0x18;
        local_410 = (double)((long)local_410 + 0x48);
      } while (uVar27 < this->nBins_);
    }
    local_338.super_Vector<double,_3U>.data_[0] = 0.0;
    local_338.super_Vector<double,_3U>.data_[1] = 0.0;
    local_338.super_Vector<double,_3U>.data_[2] = 0.0;
    local_3e8.super_Vector<double,_3U>.data_[0] = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_388,
               (long)(this->outputTypes_).
                     super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->outputTypes_).
                     super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3,
               (value_type_conflict1 *)&local_3e8,(allocator_type *)local_2e8);
    RVar9 = Snapshot::getVolume(this->currentSnap_);
    local_278._8_4_ = extraout_XMM0_Dc;
    local_278._0_8_ = RVar9;
    local_278._12_4_ = extraout_XMM0_Dd;
    uVar27 = (ulong)this->nBins_;
    if (this->nBins_ != 0) {
      lVar13 = 0;
      uVar24 = 0;
      local_398 = ZEXT816(0);
      do {
        dVar8 = (double)(uVar24 & 0xffffffff) + 0.5;
        if (this->usePeriodicBoundaryConditions_ == true) {
          (**(code **)(**(long **)(*(long *)&(((this->data_).
                                               super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             accumulator).
                                             super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                             ._M_impl.super__Vector_impl_data + uVar24 * 8) + 0x10))
                    (SUB84((dVar8 / (double)uVar27) *
                           *(double *)
                            ((long)(local_250->super_SquareMatrix<double,_3>).
                                   super_RectMatrix<double,_3U,_3U>.data_ +
                            (ulong)this->rnemdPrivilegedAxis_ * 0x20),0));
          dVar8 = (double)this->nBins_;
          auVar34._8_8_ =
               *(undefined8 *)
                ((long)(local_250->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_ + (ulong)this->rnemdPrivilegedAxis_ * 0x20);
          auVar34._0_8_ = local_278._0_8_;
          auVar7._8_4_ = SUB84(dVar8,0);
          auVar7._0_8_ = dVar8;
          auVar7._12_4_ = (int)((ulong)dVar8 >> 0x20);
          auVar35 = divpd(auVar34,auVar7);
        }
        else {
          (**(code **)(**(long **)(*(long *)&(this->data_).
                                             super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].
                                             accumulator.
                                             super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                             ._M_impl.super__Vector_impl_data + uVar24 * 8) + 0x10))
                    (SUB84(dVar8 * this->binWidth_,0));
          dVar8 = this->binWidth_;
          dVar2 = pow((double)((int)uVar24 + 1) * dVar8,3.0);
          dVar8 = pow((double)(uVar24 & 0xffffffff) * dVar8,3.0);
          auVar35._0_8_ = ((dVar2 - dVar8) * 12.566370614359172) / 3.0;
          auVar35._8_8_ = local_398._0_8_;
        }
        uVar27 = (this->outputMask_).super__Base_bitset<1UL>._M_w;
        if (((char)uVar27 < '\0') &&
           (iVar11 = local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar24], 0 < iVar11)) {
          local_3e8.super_Vector<double,_3U>.data_[0] = 0.0;
          local_3e8.super_Vector<double,_3U>.data_[1] = 0.0;
          local_3e8.super_Vector<double,_3U>.data_[2] = 0.0;
          lVar21 = 0;
          do {
            local_3e8.super_Vector<double,_3U>.data_[lVar21] =
                 *(double *)
                  ((long)((local_230.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).
                         data_ + lVar21 * 8 + lVar13) / (double)iVar11;
            lVar21 = lVar21 + 1;
          } while (lVar21 != 3);
          local_358 = local_3e8.super_Vector<double,_3U>.data_[2];
          local_368._8_4_ = local_3e8.super_Vector<double,_3U>.data_[1]._0_4_;
          local_368._0_8_ = local_3e8.super_Vector<double,_3U>.data_[0];
          local_368._12_4_ = local_3e8.super_Vector<double,_3U>.data_[1]._4_4_;
          (**(code **)(**(long **)(*(long *)&(this->data_).
                                             super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                             ._M_impl.super__Vector_impl_data._M_start[7].
                                             accumulator.
                                             super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                             ._M_impl.super__Vector_impl_data + uVar24 * 8) + 0x20))
                    ();
          uVar27 = (this->outputMask_).super__Base_bitset<1UL>._M_w;
        }
        local_398._8_4_ = auVar35._8_4_;
        local_398._0_8_ = auVar35._8_8_;
        local_398._12_4_ = auVar35._12_4_;
        if (((((uint)uVar27 >> 8 & 1) != 0) && (this->usePeriodicBoundaryConditions_ == true)) &&
           (0 < local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar24])) {
          (**(code **)(**(long **)(*(long *)&(this->data_).
                                             super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                             ._M_impl.super__Vector_impl_data._M_start[8].
                                             accumulator.
                                             super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                             ._M_impl.super__Vector_impl_data + uVar24 * 8) + 0x10))
                    ();
          uVar27 = (this->outputMask_).super__Base_bitset<1UL>._M_w;
        }
        if ((uVar27 & 0x20) != 0) {
          (**(code **)(**(long **)(*(long *)&(this->data_).
                                             super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                             ._M_impl.super__Vector_impl_data._M_start[5].
                                             accumulator.
                                             super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                             ._M_impl.super__Vector_impl_data + uVar24 * 8) + 0x10))
                    (SUB84((local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar24] * 1.66053886) / auVar35._0_8_,0
                          ));
          uVar27 = (this->outputMask_).super__Base_bitset<1UL>._M_w;
        }
        if ((uVar27 & 0x40) != 0) {
          lVar21 = (long)(this->outputTypes_).
                         super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->outputTypes_).
                         super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if (lVar21 != 0) {
            piVar6 = local_2a8.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar24].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            uVar27 = 0;
            do {
              local_388.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar27] =
                   ((double)piVar6[uVar27] / auVar35._0_8_) * 1660.5390404272;
              uVar27 = uVar27 + 1;
            } while ((uVar27 & 0xffffffff) < (ulong)(lVar21 >> 3));
          }
          (**(code **)(**(long **)(*(long *)&(this->data_).
                                             super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                             ._M_impl.super__Vector_impl_data._M_start[6].
                                             accumulator.
                                             super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                             ._M_impl.super__Vector_impl_data + uVar24 * 8) + 0x18))
                    ();
        }
        if (0 < local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar24]) {
          uVar27 = (this->outputMask_).super__Base_bitset<1UL>._M_w;
          if ((uVar27 & 8) != 0) {
            dVar8 = local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar24];
            local_3e8.super_Vector<double,_3U>.data_[0] = 0.0;
            local_3e8.super_Vector<double,_3U>.data_[1] = 0.0;
            local_3e8.super_Vector<double,_3U>.data_[2] = 0.0;
            lVar21 = 0;
            do {
              local_3e8.super_Vector<double,_3U>.data_[lVar21] =
                   *(double *)
                    ((long)((local_1a0.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).
                           data_ + lVar21 * 8 + lVar13) / dVar8;
              lVar21 = lVar21 + 1;
            } while (lVar21 != 3);
            local_2c8[2] = local_3e8.super_Vector<double,_3U>.data_[2];
            local_2c8[0] = local_3e8.super_Vector<double,_3U>.data_[0];
            local_2c8[1] = local_3e8.super_Vector<double,_3U>.data_[1];
            (**(code **)(**(long **)(*(long *)&(this->data_).
                                               super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                               ._M_impl.super__Vector_impl_data._M_start[3].
                                               accumulator.
                                               super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                               ._M_impl.super__Vector_impl_data + uVar24 * 8) + 0x20
                        ))();
            uVar27 = (this->outputMask_).super__Base_bitset<1UL>._M_w;
          }
          if ((uVar27 & 0x10) != 0) {
            SquareMatrix3<double>::inverse
                      ((SquareMatrix3<double> *)&local_3e8,
                       local_1d0.
                       super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar24);
            local_2e8[0] = 0.0;
            local_2e8[1] = 0.0;
            local_2e8[2] = 0.0;
            lVar21 = 0;
            padVar19 = (double (*) [3])&local_3e8;
            do {
              dVar8 = local_2e8[lVar21];
              lVar25 = 0;
              do {
                dVar8 = dVar8 + (((SquareMatrix<double,_3> *)*padVar19)->
                                super_RectMatrix<double,_3U,_3U>).data_[0][lVar25] *
                                *(double *)
                                 ((long)((local_1b8.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super_Vector<double,_3U>).data_ + lVar25 * 8 + lVar13);
                lVar25 = lVar25 + 1;
              } while (lVar25 != 3);
              local_2e8[lVar21] = dVar8;
              lVar21 = lVar21 + 1;
              padVar19 = padVar19 + 1;
            } while (lVar21 != 3);
            local_338.super_Vector<double,_3U>.data_[2] = local_2e8[2];
            local_338.super_Vector<double,_3U>.data_[0] = local_2e8[0];
            local_338.super_Vector<double,_3U>.data_[1] = local_2e8[1];
            (**(code **)(**(long **)(*(long *)&(this->data_).
                                               super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                               ._M_impl.super__Vector_impl_data._M_start[4].
                                               accumulator.
                                               super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                               ._M_impl.super__Vector_impl_data + uVar24 * 8) + 0x20
                        ))();
            uVar27 = (this->outputMask_).super__Base_bitset<1UL>._M_w;
          }
          if ((uVar27 & 4) != 0) {
            if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar24] < 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"No degrees of freedom in this bin?\n",0x23);
            }
            else {
              (**(code **)(**(long **)(*(long *)&(this->data_).
                                                 super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[2].
                                                 accumulator.
                                                 super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                                 ._M_impl.super__Vector_impl_data + uVar24 * 8) +
                          0x10))(SUB84((local_1e8.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start[uVar24] +
                                       local_1e8.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar24]) /
                                       ((double)local_248.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start[uVar24] *
                                        0.0019872156 * 0.0004184),0));
            }
          }
        }
        uVar24 = uVar24 + 1;
        uVar27 = (ulong)this->nBins_;
        lVar13 = lVar13 + 0x18;
      } while (uVar24 < uVar27);
    }
    this->hasData_ = true;
    if (local_388.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_388.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_388.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_388.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_2a8);
    if (local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_230.
        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_230.
                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_230.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_230.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1d0.
        super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d0.
                      super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1d0.
                            super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d0.
                            super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1b8.
        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b8.
                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1b8.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b8.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1a0.
        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a0.
                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a0.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a0.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void RNEMD::collectData() {
    if (!doRNEMD_) return;
    currentSnap_ = info_->getSnapshotManager()->getCurrentSnapshot();
    hmat_        = currentSnap_->getHmat();

    // collectData() can be called more frequently than the doRNEMD(), so use
    // the computed area from the last exchange time:
    RealType area = getDefaultDividingArea();
    areaAccumulator_.add(area);

    Vector3d u = angularMomentumFluxVector_;
    u.normalize();

    // throw an error if isDynamic instead?
    if (outputEvaluator_.isDynamic()) {
      outputSeleMan_.setSelectionSet(outputEvaluator_.evaluate());
    }

    int binNo {};
    int typeIndex(-1);
    RealType mass {};
    Vector3d vel {};
    Vector3d rPos {};
    RealType KE {};
    Vector3d L {};
    Mat3x3d I {};
    RealType r2 {};
    Vector3d eField {};
    int DOF {};

    vector<RealType> binMass(nBins_, 0.0);
    vector<Vector3d> binP(nBins_, V3Zero);
    vector<RealType> binOmega(nBins_, 0.0);
    vector<Vector3d> binL(nBins_, V3Zero);
    vector<Mat3x3d> binI(nBins_);
    vector<RealType> binKE(nBins_, 0.0);
    vector<Vector3d> binEField(nBins_, V3Zero);
    vector<int> binDOF(nBins_, 0);
    vector<int> binCount(nBins_, 0);
    vector<int> binEFieldCount(nBins_, 0);
    vector<vector<int>> binTypeCounts;

    if (outputMask_[ACTIVITY]) {
      binTypeCounts.resize(nBins_);
      for (unsigned int i = 0; i < nBins_; i++) {
        binTypeCounts[i].resize(outputTypes_.size(), 0);
      }
    }

    SimInfo::MoleculeIterator miter;
    std::vector<StuntDouble*>::iterator iiter;
    std::vector<AtomType*>::iterator at;
    Molecule* mol;
    StuntDouble* sd;
    AtomType* atype;
    ConstraintPair* consPair;
    Molecule::ConstraintPairIterator cpi;

    std::shared_ptr<SPFData> spfData = currentSnap_->getSPFData();

    for (mol = info_->beginMolecule(miter); mol != NULL;
         mol = info_->nextMolecule(miter)) {
      if (mol->getGlobalIndex() == spfData->globalID) { continue; }

      for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
           sd = mol->nextIntegrableObject(iiter)) {
        if (outputSeleMan_.isSelected(sd)) {
          Vector3d pos = sd->getPos();
          binNo        = getBin(pos);

          mass = sd->getMass();
          vel  = sd->getVel();
          rPos = sd->getPos() - coordinateOrigin_;
          KE   = 0.5 * mass * vel.lengthSquare();
          DOF  = 3;

          if (sd->isDirectional()) {
            Vector3d angMom = sd->getJ();
            Mat3x3d Ia      = sd->getI();
            if (sd->isLinear()) {
              int i = sd->linearAxis();
              int j = (i + 1) % 3;
              int k = (i + 2) % 3;
              KE += 0.5 * (angMom[j] * angMom[j] / Ia(j, j) +
                           angMom[k] * angMom[k] / Ia(k, k));
              DOF += 2;
            } else {
              KE += 0.5 * (angMom[0] * angMom[0] / Ia(0, 0) +
                           angMom[1] * angMom[1] / Ia(1, 1) +
                           angMom[2] * angMom[2] / Ia(2, 2));
              DOF += 3;
            }
          }

          L  = mass * cross(rPos, vel);
          I  = outProduct(rPos, rPos) * mass;
          r2 = rPos.lengthSquare();
          I(0, 0) += mass * r2;
          I(1, 1) += mass * r2;
          I(2, 2) += mass * r2;

          if (outputMask_[ACTIVITY]) {
            if (sd->isRigidBody()) {
              int atomBinNo;
              RigidBody* rb = static_cast<RigidBody*>(sd);
              std::vector<Atom*>::iterator ai;
              Atom* atom;
              for (atom = rb->beginAtom(ai); atom != NULL;
                   atom = rb->nextAtom(ai)) {
                typeIndex = -1;
                atomBinNo = getBin(atom->getPos());

                atype = static_cast<Atom*>(atom)->getAtomType();
                at = std::find(outputTypes_.begin(), outputTypes_.end(), atype);
                if (at != outputTypes_.end()) {
                  typeIndex = std::distance(outputTypes_.begin(), at);
                }

                if (atomBinNo >= 0 && atomBinNo < int(nBins_)) {
                  if (typeIndex != -1) binTypeCounts[atomBinNo][typeIndex]++;
                }
              }
            } else if (sd->isAtom()) {
              typeIndex = -1;
              atype     = static_cast<Atom*>(sd)->getAtomType();
              at = std::find(outputTypes_.begin(), outputTypes_.end(), atype);
              if (at != outputTypes_.end()) {
                typeIndex = std::distance(outputTypes_.begin(), at);
              }

              if (binNo >= 0 && binNo < int(nBins_)) {
                if (outputMask_[ACTIVITY] && typeIndex != -1)
                  binTypeCounts[binNo][typeIndex]++;
              }
            }
          }

          if (binNo >= 0 && binNo < int(nBins_)) {
            binCount[binNo]++;
            binMass[binNo] += mass;
            binP[binNo] += mass * vel;
            binKE[binNo] += KE;
            binI[binNo] += I;
            binL[binNo] += L;
            binDOF[binNo] += DOF;
          }
        }

        // Calculate the electric field (kcal/mol/e/Angstrom) for all atoms
        // in the box
        if (outputMask_[ELECTRICFIELD]) {
          int atomBinNo;
          if (sd->isRigidBody()) {
            RigidBody* rb = static_cast<RigidBody*>(sd);
            std::vector<Atom*>::iterator ai;
            Atom* atom;
            for (atom = rb->beginAtom(ai); atom != NULL;
                 atom = rb->nextAtom(ai)) {
              atomBinNo = getBin(atom->getPos());
              eField    = atom->getElectricField();

              if (atomBinNo >= 0 && atomBinNo < int(nBins_)) {
                binEFieldCount[atomBinNo]++;
                binEField[atomBinNo] += eField;
              }
            }
          } else {
            eField    = sd->getElectricField();
            atomBinNo = getBin(sd->getPos());

            if (atomBinNo >= 0 && atomBinNo < int(nBins_)) {
              binEFieldCount[atomBinNo]++;
              binEField[atomBinNo] += eField;
            }
          }
        }
      }

      // we need to subtract out degrees of freedom from constraints
      // belonging in this bin:
      if (outputSeleMan_.isSelected(mol)) {
        for (consPair = mol->beginConstraintPair(cpi); consPair != NULL;
             consPair = mol->nextConstraintPair(cpi)) {
          Vector3d posA = consPair->getConsElem1()->getPos();
          Vector3d posB = consPair->getConsElem2()->getPos();

          if (usePeriodicBoundaryConditions_) {
            currentSnap_->wrapVector(posA);
            currentSnap_->wrapVector(posB);
          }

          Vector3d coc = 0.5 * (posA + posB);
          int binCons  = getBin(coc);
          binDOF[binCons] -= 1;
        }
      }
    }

#ifdef IS_MPI
    for (unsigned int i = 0; i < nBins_; i++) {
      MPI_Allreduce(MPI_IN_PLACE, &binCount[i], 1, MPI_INT, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &binMass[i], 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, binP[i].getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, binL[i].getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, binI[i].getArrayPointer(), 9, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &binKE[i], 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &binDOF[i], 1, MPI_INT, MPI_SUM,
                    MPI_COMM_WORLD);

      if (outputMask_[ELECTRICFIELD]) {
        MPI_Allreduce(MPI_IN_PLACE, &binEFieldCount[i], 1, MPI_INT, MPI_SUM,
                      MPI_COMM_WORLD);
        MPI_Allreduce(MPI_IN_PLACE, binEField[i].getArrayPointer(), 3,
                      MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
      }
      if (outputMask_[ACTIVITY]) {
        MPI_Allreduce(MPI_IN_PLACE, &binTypeCounts[i][0], outputTypes_.size(),
                      MPI_INT, MPI_SUM, MPI_COMM_WORLD);
      }
    }
#endif

    Vector3d omega;
    RealType z, r, temp, binVolume, den(0.0), dz(0.0);
    std::vector<RealType> nden(outputTypes_.size(), 0.0);
    RealType boxVolume = currentSnap_->getVolume();
    RealType ePot(0.0);

    for (unsigned int i = 0; i < nBins_; i++) {
      if (usePeriodicBoundaryConditions_) {
        z = (((RealType)i + 0.5) / (RealType)nBins_) *
            hmat_(rnemdPrivilegedAxis_, rnemdPrivilegedAxis_);
        data_[Z].accumulator[i]->add(z);

        binVolume = boxVolume / nBins_;
        dz        = hmat_(rnemdPrivilegedAxis_, rnemdPrivilegedAxis_) /
             (RealType)nBins_;
      } else {
        r = (((RealType)i + 0.5) * binWidth_);
        data_[R].accumulator[i]->add(r);

        RealType rinner = (RealType)i * binWidth_;
        RealType router = (RealType)(i + 1) * binWidth_;
        binVolume =
            (4.0 * Constants::PI * (pow(router, 3) - pow(rinner, 3))) / 3.0;
      }

      // The calculations of the following properties are done regardless
      //   of whether or not the selected species are present in the bin
      if (outputMask_[ELECTRICFIELD] && binEFieldCount[i] > 0) {
        eField = binEField[i] / RealType(binEFieldCount[i]);
        data_[ELECTRICFIELD].accumulator[i]->add(eField);
      }

      if (outputMask_[ELECTROSTATICPOTENTIAL]) {
        if (usePeriodicBoundaryConditions_ && binEFieldCount[i] > 0) {
          ePot += eField[rnemdPrivilegedAxis_] * dz;
          data_[ELECTROSTATICPOTENTIAL].accumulator[i]->add(ePot);
        }
      }

      // For the following properties, zero should be added if the selected
      //   species is not present in the bin
      if (outputMask_[DENSITY]) {
        den = binMass[i] * Constants::densityConvert / binVolume;
        data_[DENSITY].accumulator[i]->add(den);
      }

      if (outputMask_[ACTIVITY]) {
        for (unsigned int j = 0; j < outputTypes_.size(); j++) {
          nden[j] = (binTypeCounts[i][j] / binVolume) *
                    Constants::concentrationConvert;
        }
        data_[ACTIVITY].accumulator[i]->add(nden);
      }

      if (binCount[i] > 0) {
        // The calculations of the following properties are meaningless if
        //   the selected species is not found in the bin
        if (outputMask_[VELOCITY]) {
          vel = binP[i] / binMass[i];
          data_[VELOCITY].accumulator[i]->add(vel);
        }

        if (outputMask_[ANGULARVELOCITY]) {
          omega = binI[i].inverse() * binL[i];
          data_[ANGULARVELOCITY].accumulator[i]->add(omega);
        }

        if (outputMask_[TEMPERATURE]) {
          if (binDOF[i] > 0) {
            temp = 2.0 * binKE[i] /
                   (binDOF[i] * Constants::kb * Constants::energyConvert);
            data_[TEMPERATURE].accumulator[i]->add(temp);
          } else {
            std::cerr << "No degrees of freedom in this bin?\n";
          }
        }
      }
    }

    hasData_ = true;
  }